

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
          (ArgVisitor<fmt::ArgFormatter<char>,_void> *this,Arg *arg)

{
  switch(arg->type) {
  case NONE:
  case NAMED_ARG:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nuertey[P]spdlog/tests/../include/spdlog/sinks/../fmt/bundled/format.h"
                  ,0x842,
                  "Result fmt::ArgVisitor<fmt::ArgFormatter<char>, void>::visit(const Arg &) [Impl = fmt::ArgFormatter<char>, Result = void]"
                 );
  case INT:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_any_int<int>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case UINT:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::
    visit_any_int<unsigned_int>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.uint_value);
    return;
  case LONG_LONG:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::
    visit_any_int<long_long>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.long_long_value);
    return;
  case ULONG_LONG:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::
    visit_any_int<unsigned_long_long>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.ulong_long_value);
    return;
  case BOOL:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_bool
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_char
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::
    visit_any_double<double>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.double_value);
    return;
  case LAST_NUMERIC_TYPE:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::
    visit_any_double<long_double>
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.long_double_value);
    break;
  case CSTRING:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_cstring
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.string.value);
    return;
  case STRING:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_string
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.string);
    return;
  case POINTER:
    internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec>::visit_pointer
              ((ArgFormatterBase<fmt::ArgFormatter<char>,_char,_fmt::FormatSpec> *)this,
               (arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    (*(arg->super_Value).field_0.custom.format)
              (*(void **)(this + 0x10),(void *)(arg->super_Value).field_0.long_long_value,
               this + 0x18);
    return;
  }
  return;
}

Assistant:

Result visit(const Arg &arg)
    {
        switch (arg.type)
        {
        case Arg::NONE:
        case Arg::NAMED_ARG:
            FMT_ASSERT(false, "invalid argument type");
            break;
        case Arg::INT:
            return FMT_DISPATCH(visit_int(arg.int_value));
        case Arg::UINT:
            return FMT_DISPATCH(visit_uint(arg.uint_value));
        case Arg::LONG_LONG:
            return FMT_DISPATCH(visit_long_long(arg.long_long_value));
        case Arg::ULONG_LONG:
            return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
        case Arg::BOOL:
            return FMT_DISPATCH(visit_bool(arg.int_value != 0));
        case Arg::CHAR:
            return FMT_DISPATCH(visit_char(arg.int_value));
        case Arg::DOUBLE:
            return FMT_DISPATCH(visit_double(arg.double_value));
        case Arg::LONG_DOUBLE:
            return FMT_DISPATCH(visit_long_double(arg.long_double_value));
        case Arg::CSTRING:
            return FMT_DISPATCH(visit_cstring(arg.string.value));
        case Arg::STRING:
            return FMT_DISPATCH(visit_string(arg.string));
        case Arg::WSTRING:
            return FMT_DISPATCH(visit_wstring(arg.wstring));
        case Arg::POINTER:
            return FMT_DISPATCH(visit_pointer(arg.pointer));
        case Arg::CUSTOM:
            return FMT_DISPATCH(visit_custom(arg.custom));
        }
        return Result();
    }